

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

HRESULT Js::ParseableFunctionInfo::MapDeferredReparseError
                  (HRESULT *hrParse,CompileScriptException *se)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = *hrParse;
  if ((iVar4 == -0x7ff8fff2) ||
     ((iVar2 = 0, iVar4 == -0x7999bffc &&
      ((((iVar1 = (se->super_ScriptException).ei.scode, iVar4 = iVar1, iVar1 == -0x7fffbffc ||
         (iVar3 = -0x7ff8fff2, iVar4 = iVar3, iVar1 == -0x7ff8fff2)) || (iVar1 == -0x7ff5fff9)) ||
       (((iVar4 = iVar1, iVar1 == -0x7ff5ebe4 || (iVar4 = iVar3, iVar1 == -0x7ff5fc17)) ||
        (iVar4 = iVar1, iVar1 == -0x7ff5ffe4)))))))) {
    *hrParse = 0;
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

HRESULT ParseableFunctionInfo::MapDeferredReparseError(HRESULT& hrParse, const CompileScriptException& se)
    {
        HRESULT hrMapped = NO_ERROR;

        switch (hrParse)
        {
        case E_OUTOFMEMORY:
            hrMapped = E_OUTOFMEMORY;
            break;

        case SCRIPT_E_RECORDED:
            switch (se.ei.scode)
            {
            case ERRnoMemory:
            case E_OUTOFMEMORY:
            case VBSERR_OutOfMemory:
                hrMapped = E_OUTOFMEMORY;
                break;

            case VBSERR_OutOfStack:
                hrMapped = VBSERR_OutOfStack;
                break;

            case JSERR_AsmJsCompileError:
                hrMapped = JSERR_AsmJsCompileError;
                break;

            case E_ABORT:
                hrMapped = E_ABORT;
                break;
            }
        }

        if (FAILED(hrMapped))
        {
            // If we have mapped error, clear hrParse. We'll throw error from hrMapped.
            hrParse = NO_ERROR;
        }

        return hrMapped;
    }